

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.h
# Opt level: O2

void __thiscall LatencySimulator::clear(LatencySimulator *this)

{
  DelayTunnel *this_00;
  DelayTunnel *this_01;
  _List_node_base *p_Var1;
  
  this_00 = &this->p12;
  p_Var1 = (_List_node_base *)this_00;
  while (p_Var1 = (((_List_base<DelayPacket_*,_std::allocator<DelayPacket_*>_> *)&p_Var1->_M_next)->
                  _M_impl)._M_node.super__List_node_base._M_next,
        p_Var1 != (_List_node_base *)this_00) {
    if (p_Var1[1]._M_next != (_List_node_base *)0x0) {
      (**(code **)(*(long *)p_Var1[1]._M_next + 8))();
    }
  }
  this_01 = &this->p21;
  p_Var1 = (_List_node_base *)this_01;
  while (p_Var1 = (((_List_base<DelayPacket_*,_std::allocator<DelayPacket_*>_> *)&p_Var1->_M_next)->
                  _M_impl)._M_node.super__List_node_base._M_next,
        p_Var1 != (_List_node_base *)this_01) {
    if (p_Var1[1]._M_next != (_List_node_base *)0x0) {
      (**(code **)(*(long *)p_Var1[1]._M_next + 8))();
    }
  }
  std::__cxx11::list<DelayPacket_*,_std::allocator<DelayPacket_*>_>::clear(this_00);
  std::__cxx11::list<DelayPacket_*,_std::allocator<DelayPacket_*>_>::clear(this_01);
  return;
}

Assistant:

void clear() {
        DelayTunnel::iterator it;
        for (it = p12.begin(); it != p12.end(); it++) {
            delete *it;
        }
        for (it = p21.begin(); it != p21.end(); it++) {
            delete *it;
        }
        p12.clear();
        p21.clear();
    }